

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket.c
# Opt level: O2

int8_t msocket_unix_listen(msocket_t *self,char *socket_path)

{
  int __fd;
  int iVar1;
  int *piVar2;
  char *__dest;
  size_t sStack_a0;
  int sockoptval;
  undefined1 local_86 [18];
  undefined8 local_74;
  undefined8 uStack_6c;
  undefined8 local_64;
  undefined8 uStack_5c;
  undefined8 local_54;
  undefined8 uStack_4c;
  undefined8 local_44;
  undefined8 uStack_3c;
  undefined8 uStack_34;
  undefined4 uStack_2c;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined8 uStack_20;
  
  if (self == (msocket_t *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
  }
  else {
    uStack_24 = 0;
    uStack_20 = 0;
    uStack_34 = 0;
    uStack_2c = 0;
    local_28 = 0;
    local_44 = 0;
    uStack_3c = 0;
    local_54 = 0;
    uStack_4c = 0;
    local_64 = 0;
    uStack_5c = 0;
    local_74 = 0;
    uStack_6c = 0;
    local_86[2] = '\0';
    local_86[3] = '\0';
    local_86[4] = '\0';
    local_86[5] = '\0';
    local_86[6] = '\0';
    local_86[7] = '\0';
    local_86[8] = '\0';
    local_86[9] = '\0';
    local_86._10_8_ = 0;
    local_86._0_2_ = 1;
    if (*socket_path == '\0') {
      __dest = local_86 + 3;
      socket_path = socket_path + 1;
      sStack_a0 = 0x6a;
    }
    else {
      __dest = local_86 + 2;
      sStack_a0 = 0x6b;
    }
    strncpy(__dest,socket_path,sStack_a0);
    __fd = socket(1,1,0);
    if (-1 < __fd) {
      sockoptval = 1;
      setsockopt(__fd,1,2,&sockoptval,4);
      iVar1 = bind(__fd,(sockaddr *)local_86,0x6e);
      if ((-1 < iVar1) && (iVar1 = listen(__fd,5), -1 < iVar1)) {
        self->tcpsockfd = __fd;
        self->state = '\x01';
        self->socketMode = self->socketMode | 2;
        return '\0';
      }
      close(__fd);
      return (int8_t)iVar1;
    }
  }
  return -1;
}

Assistant:

int8_t msocket_unix_listen(msocket_t *self, const char *socket_path)
{
   if(self != 0){

      struct sockaddr_un saddr;
      uint8_t mode = MSOCKET_MODE_TCP; //internally we can act the same way as if this is a TCP socket

      memset(&saddr, 0,sizeof(saddr));
      saddr.sun_family = AF_UNIX;
      if (*socket_path == '\0') {
         *saddr.sun_path = '\0';
         strncpy(saddr.sun_path+1, socket_path+1, sizeof(saddr.sun_path)-2);
      } else {
         strncpy(saddr.sun_path, socket_path, sizeof(saddr.sun_path)-1);
      }
      if (mode == MSOCKET_MODE_TCP){
         int rc;
         SOCKET_T sockunix;
         int sockoptval;
         socklen_t sockoptlen = sizeof(sockoptval);
         sockunix = socket(PF_LOCAL, SOCK_STREAM, 0);
         if(IS_INVALID_SOCKET(sockunix)){
            return -1;
         }
         sockoptval = 1;
         setsockopt(sockunix, SOL_SOCKET, SO_REUSEADDR, (const char*)&sockoptval, sockoptlen);
         rc=bind(sockunix, (struct sockaddr *) &saddr,sizeof(saddr));
         if (rc < 0){
            SOCKET_CLOSE(sockunix);
            return rc;
         }
         rc = listen(sockunix,5);
         if(rc<0){
            SOCKET_CLOSE(sockunix);
            return rc;
         }
         self->tcpsockfd = sockunix;
         self->state = MSOCKET_STATE_LISTENING;
         self->socketMode |= mode;
      }
      return 0;
   }
   errno = EINVAL;
   return -1;
}